

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O3

void decompressColor(int R_B,int G_B,int B_B,uint8 (*colors_RGB444) [3],uint8 (*colors) [3])

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  
  bVar1 = 8 - (char)R_B;
  bVar2 = (char)R_B - bVar1;
  (*colors)[0] = (*colors_RGB444)[0] >> (bVar2 & 0x1f) | (*colors_RGB444)[0] << (bVar1 & 0x1f);
  bVar3 = 8 - (char)G_B;
  bVar4 = (char)G_B - bVar3;
  (*colors)[1] = (*colors_RGB444)[1] >> (bVar4 & 0x1f) | (*colors_RGB444)[1] << (bVar3 & 0x1f);
  bVar5 = 8 - (char)B_B;
  bVar6 = (char)B_B - bVar5;
  (*colors)[2] = (*colors_RGB444)[2] >> (bVar6 & 0x1f) | (*colors_RGB444)[2] << (bVar5 & 0x1f);
  colors[1][0] = colors_RGB444[1][0] >> (bVar2 & 0x1f) | colors_RGB444[1][0] << (bVar1 & 0x1f);
  colors[1][1] = colors_RGB444[1][1] >> (bVar4 & 0x1f) | colors_RGB444[1][1] << (bVar3 & 0x1f);
  colors[1][2] = colors_RGB444[1][2] >> (bVar6 & 0x1f) | colors_RGB444[1][2] << (bVar5 & 0x1f);
  return;
}

Assistant:

void decompressColor(int R_B, int G_B, int B_B, uint8 (colors_RGB444)[2][3], uint8 (colors)[2][3]) 
{
	// The color should be retrieved as:
	//
	// c = round(255/(r_bits^2-1))*comp_color
	//
	// This is similar to bit replication
	// 
	// Note -- this code only work for bit replication from 4 bits and up --- 3 bits needs
	// two copy operations.

 	colors[0][R] = (colors_RGB444[0][R] << (8 - R_B)) | (colors_RGB444[0][R] >> (R_B - (8-R_B)) );
 	colors[0][G] = (colors_RGB444[0][G] << (8 - G_B)) | (colors_RGB444[0][G] >> (G_B - (8-G_B)) );
 	colors[0][B] = (colors_RGB444[0][B] << (8 - B_B)) | (colors_RGB444[0][B] >> (B_B - (8-B_B)) );
 	colors[1][R] = (colors_RGB444[1][R] << (8 - R_B)) | (colors_RGB444[1][R] >> (R_B - (8-R_B)) );
 	colors[1][G] = (colors_RGB444[1][G] << (8 - G_B)) | (colors_RGB444[1][G] >> (G_B - (8-G_B)) );
 	colors[1][B] = (colors_RGB444[1][B] << (8 - B_B)) | (colors_RGB444[1][B] >> (B_B - (8-B_B)) );
}